

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void PVG_FT_Raster_Render(PVG_FT_Raster_Params *params)

{
  void *buffer;
  void *heap;
  int error;
  int rendered_spans;
  TWorker worker;
  size_t length;
  char stack [8192];
  PVG_FT_Raster_Params *params_local;
  
  worker.ycount = 0x2000;
  worker.gray_spans[0xff].coverage = '\0';
  worker.gray_spans[0xff]._13_3_ = 0;
  heap._4_4_ = 0;
  heap._0_4_ = gray_raster_render((PWorker)&error,&length,0x2000,params);
  while ((int)heap == -6) {
    if ((int)worker.gray_spans[0xff]._12_4_ < 0) {
      heap._4_4_ = heap._4_4_ - worker.gray_spans[0xff]._12_4_;
    }
    worker.gray_spans[0xff]._12_4_ = heap._4_4_;
    worker.ycount = worker.ycount << 1;
    buffer = malloc(worker.ycount);
    heap._0_4_ = gray_raster_render((PWorker)&error,buffer,worker.ycount,params);
    free(buffer);
  }
  return;
}

Assistant:

void
  PVG_FT_Raster_Render(const PVG_FT_Raster_Params *params)
  {
      char stack[PVG_FT_MINIMUM_POOL_SIZE];
      size_t length = PVG_FT_MINIMUM_POOL_SIZE;

      TWorker worker;
      worker.skip_spans = 0;
      int rendered_spans = 0;
      int error = gray_raster_render(&worker, stack, length, params);
      while(error == ErrRaster_OutOfMemory) {
          if(worker.skip_spans < 0)
              rendered_spans += -worker.skip_spans;
          worker.skip_spans = rendered_spans;
          length *= 2;
          void* heap = malloc(length);
          error = gray_raster_render(&worker, heap, length, params);
          free(heap);
      }
  }